

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::TokenTest_SigningMessage_Test::TestBody(TokenTest_SigningMessage_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  char *pcVar3;
  ByteArray *lhs;
  AssertHelper local_1600;
  Message local_15f8;
  ErrorCode local_15ec;
  Error local_15e8;
  undefined1 local_15c0 [8];
  AssertionResult gtest_ar_8;
  Message local_15a8;
  ErrorCode local_159c;
  Error local_1598;
  undefined1 local_1570 [8];
  AssertionResult gtest_ar_7;
  ByteArray signature;
  Message local_1540;
  ErrorCode local_1534;
  Tlv local_1530;
  Error local_1510;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_6;
  Message local_14d0;
  ErrorCode local_14c8;
  allocator local_14c1;
  string local_14c0;
  Error local_14a0;
  undefined1 local_1478 [8];
  AssertionResult gtest_ar_5;
  Message pet;
  Message local_13d8;
  undefined1 local_13d0 [8];
  AssertionResult gtest_ar_4;
  Message local_13b8;
  ErrorCode local_13ac;
  Error local_13a8;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar_3;
  Message local_1368;
  ErrorCode local_135c;
  Error local_1358;
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_2;
  ByteArray signedToken;
  Message local_1300;
  ErrorCode local_12f4;
  Error local_12f0;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar_1;
  TokenManager tokenManager;
  Message local_1d8;
  void *local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  event_base *eventBase;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  value_type_conflict local_17a;
  allocator<unsigned_char> local_179;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  value_type_conflict local_14a;
  allocator<unsigned_char> local_149;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  undefined1 local_110 [8];
  Config config;
  TokenTest_SigningMessage_Test *this_local;
  
  config.mThreadSMRoot.field_2._8_8_ = this;
  Config::Config((Config *)local_110);
  std::__cxx11::string::operator=((string *)&config.mEnableDtlsDebugLogging,"Thread");
  local_140._M_current = (char *)std::__cxx11::string::begin();
  local_148._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_149);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_138,local_140,local_148,
             &local_149);
  ppuVar1 = &config.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,&local_138);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_138);
  std::allocator<unsigned_char>::~allocator(&local_149);
  local_14a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,&local_14a);
  local_170._M_current = (char *)std::__cxx11::string::begin();
  local_178._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_179);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_168,local_170,local_178,
             &local_179);
  ppuVar1 = &config.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,&local_168);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_168);
  std::allocator<unsigned_char>::~allocator(&local_179);
  local_17a = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,&local_17a);
  local_1a0._M_current = (char *)std::__cxx11::string::begin();
  local_1a8._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&eventBase + 7));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_198,local_1a0,local_1a8,
             (allocator<unsigned_char> *)((long)&eventBase + 7));
  ppuVar1 = &config.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,&local_198);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_198);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&eventBase + 7));
  eventBase._6_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1,
             (value_type_conflict *)((long)&eventBase + 6));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )event_base_new();
  local_1d0 = (void *)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)local_1c8,"eventBase","nullptr",(event_base **)&gtest_ar.message_,
             &local_1d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tokenManager.mRegistrarClient.mCoap.mEndpoint,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tokenManager.mRegistrarClient.mCoap.mEndpoint,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tokenManager.mRegistrarClient.mCoap.mEndpoint);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  TokenManager::TokenManager
            ((TokenManager *)&gtest_ar_1.message_,
             (event_base *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  TokenManager::Init(&local_12f0,(TokenManager *)&gtest_ar_1.message_,(Config *)local_110);
  local_12f4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_12c8,"tokenManager.Init(config)","ErrorCode::kNone",&local_12f0,
             &local_12f4);
  Error::~Error(&local_12f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c8);
  if (!bVar2) {
    testing::Message::Message(&local_1300);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_12c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &signedToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &signedToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1300);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &signedToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2.message_);
  utils::Hex(&local_1358,(ByteArray *)&gtest_ar_2.message_,(string *)kSignedToken_abi_cxx11_);
  local_135c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1330,"utils::Hex(signedToken, kSignedToken)","ErrorCode::kNone",
             &local_1358,&local_135c);
  Error::~Error(&local_1358);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1330);
  if (!bVar2) {
    testing::Message::Message(&local_1368);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1330);
  TokenManager::SetToken
            (&local_13a8,(TokenManager *)&gtest_ar_1.message_,(ByteArray *)&gtest_ar_2.message_,
             false);
  local_13ac = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1380,"tokenManager.SetToken(signedToken)","ErrorCode::kNone",
             &local_13a8,&local_13ac);
  Error::~Error(&local_13a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
  if (!bVar2) {
    testing::Message::Message(&local_13b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_13b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_13b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
  lhs = TokenManager::GetToken((TokenManager *)&gtest_ar_1.message_);
  testing::internal::EqHelper::
  Compare<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_13d0,"tokenManager.GetToken()","signedToken",lhs,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13d0);
  if (!bVar2) {
    testing::Message::Message(&local_13d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_13d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pet.mEndpoint,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pet.mEndpoint,&local_13d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pet.mEndpoint);
    testing::Message::~Message(&local_13d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13d0);
  coap::Message::Message((Message *)&gtest_ar_5.message_,kConfirmable,kPost);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14c0,"/c/cp",&local_14c1);
  coap::Message::SetUriPath(&local_14a0,(Message *)&gtest_ar_5.message_,&local_14c0);
  local_14c8 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1478,"pet.SetUriPath(uri::kPetitioning)","ErrorCode::kNone",
             &local_14a0,&local_14c8);
  Error::~Error(&local_14a0);
  std::__cxx11::string::~string((string *)&local_14c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14c1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1478);
  if (!bVar2) {
    testing::Message::Message(&local_14d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_14d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_14d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1478);
  tlv::Tlv::Tlv(&local_1530,kCommissionerId,(string *)((long)&config.mDomainName.field_2 + 8),
                kMeshCoP);
  AppendTlv(&local_1510,(Message *)&gtest_ar_5.message_,&local_1530);
  local_1534 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_14e8,"AppendTlv(pet, {tlv::Type::kCommissionerId, config.mId})",
             "ErrorCode::kNone",&local_1510,&local_1534);
  Error::~Error(&local_1510);
  tlv::Tlv::~Tlv(&local_1530);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
  if (!bVar2) {
    testing::Message::Message(&local_1540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1540);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7.message_);
  TokenManager::SignMessage
            (&local_1598,(TokenManager *)&gtest_ar_1.message_,(ByteArray *)&gtest_ar_7.message_,
             (Message *)&gtest_ar_5.message_);
  local_159c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1570,"tokenManager.SignMessage(signature, pet)","ErrorCode::kNone",
             &local_1598,&local_159c);
  Error::~Error(&local_1598);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1570);
  if (!bVar2) {
    testing::Message::Message(&local_15a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_15a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_15a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1570);
  TokenManager::ValidateSignature
            (&local_15e8,(TokenManager *)&gtest_ar_1.message_,(ByteArray *)&gtest_ar_7.message_,
             (Message *)&gtest_ar_5.message_);
  local_15ec = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_15c0,"tokenManager.ValidateSignature(signature, pet)",
             "ErrorCode::kNone",&local_15e8,&local_15ec);
  Error::~Error(&local_15e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c0);
  if (!bVar2) {
    testing::Message::Message(&local_15f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_15c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager_test.cpp"
               ,0x7d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1600,&local_15f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1600);
    testing::Message::~Message(&local_15f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7.message_);
  coap::Message::~Message((Message *)&gtest_ar_5.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2.message_);
  TokenManager::~TokenManager((TokenManager *)&gtest_ar_1.message_);
  Config::~Config((Config *)local_110);
  return;
}

Assistant:

TEST(TokenTest, SigningMessage)
{
    Config config;

    config.mDomainName = "Thread";

    config.mTrustAnchor = {kCommTrustAnchor.begin(), kCommTrustAnchor.end()};
    config.mTrustAnchor.push_back(0);

    config.mCertificate = {kCommCert.begin(), kCommCert.end()};
    config.mCertificate.push_back(0);

    config.mPrivateKey = {kCommKey.begin(), kCommKey.end()};
    config.mPrivateKey.push_back(0);

    struct event_base *eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    TokenManager tokenManager{eventBase};

    EXPECT_EQ(tokenManager.Init(config), ErrorCode::kNone);

    ByteArray signedToken;
    EXPECT_EQ(utils::Hex(signedToken, kSignedToken), ErrorCode::kNone);
    EXPECT_EQ(tokenManager.SetToken(signedToken), ErrorCode::kNone);
    EXPECT_EQ(tokenManager.GetToken(), signedToken);

    coap::Message pet{coap::Type::kConfirmable, coap::Code::kPost};
    EXPECT_EQ(pet.SetUriPath(uri::kPetitioning), ErrorCode::kNone);
    EXPECT_EQ(AppendTlv(pet, {tlv::Type::kCommissionerId, config.mId}), ErrorCode::kNone);

    ByteArray signature;
    EXPECT_EQ(tokenManager.SignMessage(signature, pet), ErrorCode::kNone);
    EXPECT_EQ(tokenManager.ValidateSignature(signature, pet), ErrorCode::kNone);
}